

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool wildcard_match(char *wildcard,char *target)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = strcmp(wildcard,"*");
  if (iVar2 != 0) {
    _Var1 = wildcard_match_rec(wildcard,target);
    return _Var1;
  }
  return true;
}

Assistant:

bool wildcard_match(const char *wildcard, const char *target)
{
#if (defined(_WIN32) && !defined(__CYGWIN__))
	if (strcmp(wildcard, "*.*") == 0)
	{
		return true;
	}
#endif
	if (strcmp(wildcard, "*") == 0)
	{
		return true;
	}
	else
	{
		return wildcard_match_rec(wildcard, target);
	}
}